

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O1

int mg_session_send_init_message(mg_session *session,char *client_name,mg_map *auth_token)

{
  int iVar1;
  size_t sVar2;
  char local_2a [2];
  
  sVar2 = strlen(client_name);
  iVar1 = -0x10;
  if (sVar2 >> 0x20 == 0) {
    local_2a[0] = -0x4e;
    iVar1 = mg_session_write_raw(session,local_2a,1);
    if (iVar1 == 0) {
      local_2a[1] = 1;
      iVar1 = mg_session_write_raw(session,local_2a + 1,1);
      if (((iVar1 == 0) &&
          (iVar1 = mg_session_write_string2(session,(uint32_t)sVar2,client_name), iVar1 == 0)) &&
         (iVar1 = mg_session_write_map(session,auth_token), iVar1 == 0)) {
        iVar1 = mg_session_flush_message(session);
      }
    }
  }
  return iVar1;
}

Assistant:

int mg_session_send_init_message(mg_session *session, const char *client_name,
                                 const mg_map *auth_token) {
  size_t client_name_len = strlen(client_name);
  if (client_name_len > UINT32_MAX) {
    return MG_ERROR_SIZE_EXCEEDED;
  }
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, (uint8_t)(MG_MARKER_TINY_STRUCT + 2)));
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, MG_SIGNATURE_MESSAGE_HELLO));
  MG_RETURN_IF_FAILED(mg_session_write_string2(
      session, (uint32_t)client_name_len, client_name));
  MG_RETURN_IF_FAILED(mg_session_write_map(session, auth_token));
  return mg_session_flush_message(session);
}